

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseCustomSectionAnnotation(WastParser *this,Module *module)

{
  char *pcVar1;
  pointer pbVar2;
  pointer pbVar3;
  bool bVar4;
  Result RVar5;
  TokenType TVar6;
  Result RVar7;
  long lVar8;
  char *__n;
  char **ppcVar9;
  long *plVar10;
  void *pvVar11;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string section_name;
  Location loc;
  Token token;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  void *local_238;
  ulong local_230;
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_220;
  string local_218;
  char *local_1f8;
  int *piStack_1f0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_1e8;
  undefined8 uStack_1e0;
  undefined1 local_1d0 [32];
  char **local_1b0;
  undefined1 auStack_1a8 [8];
  char *local_1a0 [2];
  int *piStack_190;
  anon_union_16_2_ecfd7102_for_Location_1 local_188;
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  long *local_90 [2];
  long local_80 [2];
  Token local_70;
  
  GetToken((Token *)local_1d0,this);
  local_1e8.offset = local_1d0._16_8_;
  uStack_1e0 = local_1d0._24_8_;
  local_1f8 = (char *)local_1d0._0_8_;
  piStack_1f0 = (int *)local_1d0._8_8_;
  Consume(&local_70,this);
  if (5 < local_70.token_type_ - AlignEqNat) {
    __assert_fail("HasText()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/token.h"
                  ,99,"std::string_view wabt::Token::text() const");
  }
  if ((local_70.field_2.text_._M_len != 6) ||
     (*(short *)(local_70.field_2.literal_.text._M_len + 4) != 0x6d6f ||
      *(int *)local_70.field_2.text_._M_str != 0x74737563)) {
    __assert_fail("!\"ParseCustomSectionAnnotation should only be called if PeekIsCustom() is true\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                  ,0x4de,"Result wabt::WastParser::ParseCustomSectionAnnotation(Module *)");
  }
  local_218._M_string_length = 0;
  local_218.field_2._M_local_buf[0] = '\0';
  RVar7.enum_ = Error;
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  RVar5 = ParseQuotedText(this,&local_218,true);
  if (RVar5.enum_ == Error) goto LAB_00183ac5;
  bVar4 = Match(this,Lpar);
  if (bVar4) {
    TVar6 = Peek(this,0);
    if ((TVar6 != After) && (TVar6 = Peek(this,0), TVar6 != Before)) {
      local_1d0._0_8_ = local_1d0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"before","");
      ppcVar9 = &(((anon_union_24_4_98baf137_for_Token_2 *)auStack_1a8)->text_)._M_str;
      local_1b0 = ppcVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"after","");
      local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_258,
                 (string *)local_1d0,&piStack_190);
      RVar7 = ErrorExpected(this,&local_258,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_258);
      lVar8 = -0x40;
      do {
        if (ppcVar9 != (char **)ppcVar9[-2]) {
          operator_delete(ppcVar9[-2],(ulong)(*ppcVar9 + 1));
        }
        ppcVar9 = ppcVar9 + -4;
        lVar8 = lVar8 + 0x20;
      } while (lVar8 != 0);
      goto LAB_00183ac5;
    }
    Consume((Token *)local_1d0,this);
    TVar6 = Peek(this,0);
    if ((0x3b < TVar6 - Data) || ((0x800002a00043521U >> ((ulong)(TVar6 - Data) & 0x3f) & 1) == 0))
    {
      local_1d0._0_8_ = local_1d0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"type","");
      local_1b0 = &(((anon_union_24_4_98baf137_for_Token_2 *)auStack_1a8)->text_)._M_str;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"import","");
      piStack_190 = &local_188.field_0.last_column;
      std::__cxx11::string::_M_construct<char_const*>((string *)&piStack_190,"function","");
      local_170[0] = local_160;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"table","");
      local_150[0] = local_140;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"memory","");
      local_130[0] = local_120;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"global","");
      local_110[0] = local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"export","");
      local_f0[0] = local_e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"start","");
      local_d0[0] = local_c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"elem","");
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"code","");
      plVar10 = local_80;
      local_90[0] = plVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"data","");
      local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_258,
                 (string *)local_1d0,&local_70);
      RVar7 = ErrorExpected(this,&local_258,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_258);
      lVar8 = -0x160;
      do {
        if (plVar10 != (long *)plVar10[-2]) {
          operator_delete((long *)plVar10[-2],*plVar10 + 1);
        }
        plVar10 = plVar10 + -4;
        lVar8 = lVar8 + 0x20;
      } while (lVar8 != 0);
      goto LAB_00183ac5;
    }
    Consume((Token *)local_1d0,this);
    RVar5 = Expect(this,Rpar);
    if (RVar5.enum_ == Error) goto LAB_00183ac5;
  }
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = ParseTextListOpt(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_258)
  ;
  RVar7.enum_ = Error;
  if ((bVar4) && (RVar5 = Expect(this,Rpar), RVar5.enum_ != Error)) {
    local_230 = (long)local_258.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_258.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    local_220 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p;
    local_228 = local_218._M_string_length;
    if (local_230 == 0) {
      local_238 = (void *)0x0;
      __n = (char *)0x0;
    }
    else {
      if ((long)local_230 < 0) goto LAB_00183d09;
      local_238 = operator_new(local_230);
      __n = (char *)((long)local_258.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_258.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    }
    pbVar3 = local_258.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar2 = local_258.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_258.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_258.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      memmove(local_238,
              local_258.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start,(size_t)__n);
    }
    local_1d0._0_8_ = local_1d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d0,local_220,local_220->_M_local_buf + local_228);
    local_1b0 = (char **)0x0;
    auStack_1a8 = (undefined1  [8])0x0;
    local_1a0[0] = (char *)0x0;
    if (pbVar3 == pbVar2) {
      local_1b0 = (char **)0x0;
      pvVar11 = local_238;
      local_1a0[0] = __n;
    }
    else {
      if ((long)__n < 0) {
LAB_00183d09:
        std::__throw_bad_alloc();
      }
      local_1b0 = (char **)operator_new((ulong)__n);
      pvVar11 = local_238;
      pcVar1 = (char *)((long)local_1b0 + (long)__n);
      local_1a0[0] = pcVar1;
      memcpy(local_1b0,local_238,(size_t)__n);
      __n = pcVar1;
    }
    local_1a0[1] = local_1f8;
    piStack_190 = piStack_1f0;
    local_188.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_1e8.offset;
    local_188._8_8_ = uStack_1e0;
    auStack_1a8 = (undefined1  [8])__n;
    if (pvVar11 != (void *)0x0) {
      operator_delete(pvVar11,local_230);
    }
    std::vector<wabt::Custom,_std::allocator<wabt::Custom>_>::push_back
              (&module->customs,(value_type *)local_1d0);
    if (local_1b0 != (char **)0x0) {
      operator_delete(local_1b0,(long)local_1a0[0] - (long)local_1b0);
    }
    if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
      operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
    }
    RVar7.enum_ = Ok;
  }
  if (local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_258.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_00183ac5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,
                    CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                             local_218.field_2._M_local_buf[0]) + 1);
  }
  return (Result)RVar7.enum_;
}

Assistant:

Result WastParser::ParseCustomSectionAnnotation(Module* module) {
  WABT_TRACE(ParseCustomSectionAnnotation);
  Location loc = GetLocation();
  Token token = Consume();
  if (token.text() != "custom") {
    assert(
        !"ParseCustomSectionAnnotation should only be called if PeekIsCustom() is true");
    return Result::Error;
  }
  std::string section_name;
  CHECK_RESULT(ParseQuotedText(&section_name));
  if (Match(TokenType::Lpar)) {
    if (!PeekMatch(TokenType::After) && !PeekMatch(TokenType::Before)) {
      return ErrorExpected({"before", "after"});
    }
    Consume();
    switch (Peek()) {
      case TokenType::Function:
      case TokenType::Type:
      case TokenType::Import:
      case TokenType::Export:
      case TokenType::Table:
      case TokenType::Global:
      case TokenType::Elem:
      case TokenType::Data:
      case TokenType::Memory:
      case TokenType::Code:
      case TokenType::Start: {
        Consume();
        break;
      }
      default: {
        return ErrorExpected({"type", "import", "function", "table", "memory",
                              "global", "export", "start", "elem", "code",
                              "data"});
      }
    }
    EXPECT(Rpar);
  }
  std::vector<uint8_t> data;
  CHECK_RESULT(ParseTextList(&data));
  EXPECT(Rpar);

  Custom custom = Custom(loc, section_name, data);
  module->customs.push_back(custom);

  return Result::Ok;
}